

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O2

void __thiscall
MipsMacroCommand::MipsMacroCommand
          (MipsMacroCommand *this,
          unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *content,
          int macroFlags)

{
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__MipsMacroCommand_001baed0;
  (this->content)._M_t.
  super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
  super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
  super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl = (CAssemblerCommand *)0x0;
  std::__uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator=
            ((__uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)
             &this->content,
             (__uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)content)
  ;
  this->macroFlags = macroFlags;
  this->IgnoreLoadDelay = Mips.IgnoreLoadDelay;
  return;
}

Assistant:

MipsMacroCommand::MipsMacroCommand(std::unique_ptr<CAssemblerCommand> content, int macroFlags)
{
	this->content = std::move(content);
	this->macroFlags = macroFlags;
	IgnoreLoadDelay = Mips.GetIgnoreDelay();
}